

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt,int options)

{
  char **ppcVar1;
  int *piVar2;
  uint local_14;
  int options_local;
  xmlSaveCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    ppcVar1 = __xmlTreeIndentString();
    xmlSaveSetIndentString(ctxt,*ppcVar1);
    if ((options & 1U) == 0) {
      if ((options & 0x80U) != 0) {
        ctxt->format = 2;
      }
    }
    else {
      ctxt->format = 1;
    }
    local_14 = options;
    if (((options & 0x100U) == 0) && (piVar2 = __xmlSaveNoEmptyTags(), *piVar2 != 0)) {
      local_14 = options | 4;
    }
    ctxt->options = local_14;
  }
  return;
}

Assistant:

static void
xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt, int options)
{
    if (ctxt == NULL) return;

    xmlSaveSetIndentString(ctxt, xmlTreeIndentString);

    if (options & XML_SAVE_FORMAT)
        ctxt->format = 1;
    else if (options & XML_SAVE_WSNONSIG)
        ctxt->format = 2;

    if (((options & XML_SAVE_EMPTY) == 0) &&
        (xmlSaveNoEmptyTags))
	options |= XML_SAVE_NO_EMPTY;

    ctxt->options = options;
}